

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O2

void __thiscall
dg::pta::LLVMPointerGraphBuilder::LLVMPointerGraphBuilder
          (LLVMPointerGraphBuilder *this,Module *m,LLVMPointerAnalysisOptions *opts)

{
  PointerGraph::PointerGraph(&this->PS);
  (this->mapping).mapping._M_h._M_buckets = &(this->mapping).mapping._M_h._M_single_bucket;
  (this->mapping).mapping._M_h._M_bucket_count = 1;
  (this->mapping).mapping._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mapping).mapping._M_h._M_element_count = 0;
  (this->mapping).mapping._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mapping).mapping._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mapping).mapping._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->M = m;
  LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions(&this->_options,opts);
  this->ad_hoc_building = false;
  this->invalidate_nodes = false;
  this->threads_ = opts->threads;
  (this->_funcInfo)._M_h._M_buckets = &(this->_funcInfo)._M_h._M_single_bucket;
  (this->_funcInfo)._M_h._M_bucket_count = 1;
  (this->_funcInfo)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_funcInfo)._M_h._M_element_count = 0;
  (this->_funcInfo)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_funcInfo)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_funcInfo)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->nodes_map)._M_h._M_buckets = &(this->nodes_map)._M_h._M_single_bucket;
  (this->nodes_map)._M_h._M_bucket_count = 1;
  (this->nodes_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->nodes_map)._M_h._M_element_count = 0;
  (this->nodes_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->nodes_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->nodes_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->subgraphs_map)._M_h._M_buckets = &(this->subgraphs_map)._M_h._M_single_bucket;
  (this->subgraphs_map)._M_h._M_bucket_count = 1;
  (this->subgraphs_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->subgraphs_map)._M_h._M_element_count = 0;
  (this->subgraphs_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->subgraphs_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->subgraphs_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->forkNodes).
  super__Vector_base<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->forkNodes).
  super__Vector_base<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->forkNodes).
  super__Vector_base<dg::pta::PSNodeFork_*,_std::allocator<dg::pta::PSNodeFork_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->joinNodes).
  super__Vector_base<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->joinNodes).
  super__Vector_base<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->joinNodes).
  super__Vector_base<dg::pta::PSNodeJoin_*,_std::allocator<dg::pta::PSNodeJoin_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

LLVMPointerGraphBuilder(const llvm::Module *m,
                            const LLVMPointerAnalysisOptions &opts)
            : M(m), _options(opts), threads_(opts.threads) {}